

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checksum.cpp
# Opt level: O0

string * computeChecksum_abi_cxx11_(string *__return_storage_ptr__,void *data,int length)

{
  void *pvVar1;
  int local_1c4;
  ostringstream local_1c0 [4];
  int i;
  ostringstream ss;
  byte local_48 [8];
  BYTE hash [32];
  int length_local;
  void *data_local;
  
  sha256(data,length,local_48);
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  for (local_1c4 = 0; local_1c4 < 0x20; local_1c4 = local_1c4 + 1) {
    pvVar1 = (void *)std::ostream::operator<<(local_1c0,std::hex);
    pvVar1 = (void *)std::ostream::operator<<(pvVar1,std::uppercase);
    std::ostream::operator<<(pvVar1,(uint)local_48[local_1c4]);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string computeChecksum(const void* data, int length)
{
    BYTE hash[32];
    sha256(data, length, hash);

    std::ostringstream ss;
    for (int i = 0; i < 32; ++i)
        ss << std::hex << std::uppercase << static_cast<int>(hash[i]);

    return ss.str();
}